

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

void Cmd_load(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  FString local_28;
  FString fname;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  fname.Chars._4_4_ = key;
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 2) {
    if ((netgame & 1U) == 0) {
      pcVar2 = FCommandLine::operator[](argv,1);
      FString::FString(&local_28,pcVar2);
      DefaultExtension(&local_28,".zds");
      pcVar2 = FString::operator_cast_to_char_(&local_28);
      G_LoadGame(pcVar2,false);
      FString::~FString(&local_28);
    }
    else {
      Printf("cannot load during a network game\n");
    }
  }
  else {
    Printf("usage: load <filename>\n");
  }
  return;
}

Assistant:

CCMD (load)
{
    if (argv.argc() != 2)
	{
        Printf ("usage: load <filename>\n");
        return;
    }
	if (netgame)
	{
		Printf ("cannot load during a network game\n");
		return;
	}
	FString fname = argv[1];
	DefaultExtension (fname, ".zds");
    G_LoadGame (fname);
}